

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O0

Element __thiscall wasm::RandomLattice::makeElement(RandomLattice *this)

{
  undefined8 this_00;
  Lift<wasm::RandomLattice> *this_01;
  bool bVar1;
  pointer pLVar2;
  Element *pEVar3;
  void *extraout_RDX;
  uint *val;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  _Head_base<0UL,_void_*,_false> _Var4;
  undefined8 *in_RSI;
  Flat<unsigned_int> *this_02;
  Element EVar5;
  Element EVar6;
  ElementImpl local_2d8;
  RandomLattice local_2b0;
  Element *local_2a0;
  Seq local_298;
  undefined1 local_290 [8];
  Element elem_1;
  type *l_6;
  RandomLattice local_268;
  tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>
  local_258;
  ElementImpl local_238;
  add_pointer_t<wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>_> local_210;
  type *l_5;
  RandomLattice local_1e0;
  _Head_base<1UL,_void_(*)(void_*),_false> local_1d0;
  size_t i;
  vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
  elem;
  type *l_4;
  RandomLattice local_198;
  ElementImpl local_188;
  add_pointer_t<wasm::analysis::Array<wasm::RandomLattice,_2UL>_> local_160;
  type *l_3;
  RandomLattice local_150;
  Element local_140;
  ElementImpl local_128;
  Lift<wasm::RandomLattice> *local_100;
  type *l_2;
  ElementImpl local_f0;
  _Variadic_union<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
  local_c8;
  undefined1 local_c4;
  ElementImpl local_c0;
  _Variadic_union<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
  local_98;
  undefined1 local_94;
  ElementImpl local_90;
  uint32_t local_64;
  add_pointer_t<wasm::analysis::Flat<unsigned_int>_> ptStack_60;
  uint32_t pick;
  type *l_1;
  ElementImpl local_48;
  add_pointer_t<wasm::RandomFullLattice> local_20;
  type *l;
  RandomLattice *this_local;
  
  this_local = this;
  pLVar2 = std::
           unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
           ::get((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                  *)(in_RSI + 1));
  local_20 = std::
             get_if<wasm::RandomFullLattice,wasm::RandomFullLattice,wasm::analysis::Flat<unsigned_int>,wasm::analysis::Lift<wasm::RandomLattice>,wasm::analysis::Array<wasm::RandomLattice,2ul>,wasm::analysis::Vector<wasm::RandomLattice>,wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,wasm::analysis::SharedPath<wasm::RandomLattice>>
                       (&pLVar2->super_LatticeVariant);
  if (local_20 == (add_pointer_t<wasm::RandomFullLattice>)0x0) {
    pLVar2 = std::
             unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
             ::get((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                    *)(in_RSI + 1));
    ptStack_60 = std::
                 get_if<wasm::analysis::Flat<unsigned_int>,wasm::RandomFullLattice,wasm::analysis::Flat<unsigned_int>,wasm::analysis::Lift<wasm::RandomLattice>,wasm::analysis::Array<wasm::RandomLattice,2ul>,wasm::analysis::Vector<wasm::RandomLattice>,wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,wasm::analysis::SharedPath<wasm::RandomLattice>>
                           (&pLVar2->super_LatticeVariant);
    if (ptStack_60 == (add_pointer_t<wasm::analysis::Flat<unsigned_int>_>)0x0) {
      pLVar2 = std::
               unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
               ::get((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                      *)(in_RSI + 1));
      local_100 = std::
                  get_if<wasm::analysis::Lift<wasm::RandomLattice>,wasm::RandomFullLattice,wasm::analysis::Flat<unsigned_int>,wasm::analysis::Lift<wasm::RandomLattice>,wasm::analysis::Array<wasm::RandomLattice,2ul>,wasm::analysis::Vector<wasm::RandomLattice>,wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,wasm::analysis::SharedPath<wasm::RandomLattice>>
                            (&pLVar2->super_LatticeVariant);
      if (local_100 == (add_pointer_t<wasm::analysis::Lift<wasm::RandomLattice>_>)0x0) {
        pLVar2 = std::
                 unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                 ::get((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                        *)(in_RSI + 1));
        local_160 = std::
                    get_if<wasm::analysis::Array<wasm::RandomLattice,2ul>,wasm::RandomFullLattice,wasm::analysis::Flat<unsigned_int>,wasm::analysis::Lift<wasm::RandomLattice>,wasm::analysis::Array<wasm::RandomLattice,2ul>,wasm::analysis::Vector<wasm::RandomLattice>,wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,wasm::analysis::SharedPath<wasm::RandomLattice>>
                              (&pLVar2->super_LatticeVariant);
        if (local_160 == (add_pointer_t<wasm::analysis::Array<wasm::RandomLattice,_2UL>_>)0x0) {
          pLVar2 = std::
                   unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                   ::get((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                          *)(in_RSI + 1));
          elem.
          super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)std::
                        get_if<wasm::analysis::Vector<wasm::RandomLattice>,wasm::RandomFullLattice,wasm::analysis::Flat<unsigned_int>,wasm::analysis::Lift<wasm::RandomLattice>,wasm::analysis::Array<wasm::RandomLattice,2ul>,wasm::analysis::Vector<wasm::RandomLattice>,wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,wasm::analysis::SharedPath<wasm::RandomLattice>>
                                  (&pLVar2->super_LatticeVariant);
          if ((add_pointer_t<wasm::analysis::Vector<wasm::RandomLattice>_>)
              elem.
              super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage ==
              (add_pointer_t<wasm::analysis::Vector<wasm::RandomLattice>_>)0x0) {
            pLVar2 = std::
                     unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                     ::get((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                            *)(in_RSI + 1));
            local_210 = std::
                        get_if<wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,wasm::RandomFullLattice,wasm::analysis::Flat<unsigned_int>,wasm::analysis::Lift<wasm::RandomLattice>,wasm::analysis::Array<wasm::RandomLattice,2ul>,wasm::analysis::Vector<wasm::RandomLattice>,wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,wasm::analysis::SharedPath<wasm::RandomLattice>>
                                  (&pLVar2->super_LatticeVariant);
            if (local_210 ==
                (add_pointer_t<wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>_>)0x0
               ) {
              pLVar2 = std::
                       unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                       ::get((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
                              *)(in_RSI + 1));
              elem_1._8_8_ = std::
                             get_if<wasm::analysis::SharedPath<wasm::RandomLattice>,wasm::RandomFullLattice,wasm::analysis::Flat<unsigned_int>,wasm::analysis::Lift<wasm::RandomLattice>,wasm::analysis::Array<wasm::RandomLattice,2ul>,wasm::analysis::Vector<wasm::RandomLattice>,wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,wasm::analysis::SharedPath<wasm::RandomLattice>>
                                       (&pLVar2->super_LatticeVariant);
              if ((add_pointer_t<wasm::analysis::SharedPath<wasm::RandomLattice>_>)elem_1._8_8_ ==
                  (add_pointer_t<wasm::analysis::SharedPath<wasm::RandomLattice>_>)0x0) {
                wasm::handle_unreachable
                          ("unexpected lattice",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-fuzz-lattices.cpp"
                           ,0x17f);
              }
              EVar5 = analysis::SharedPath<wasm::RandomLattice>::getBottom
                                ((SharedPath<wasm::RandomLattice> *)elem_1._8_8_);
              this_00 = elem_1._8_8_;
              local_2a0 = EVar5.val;
              local_298 = EVar5.seq;
              local_290 = (undefined1  [8])local_2a0;
              elem_1.val._0_4_ = local_298;
              makeElement(&local_2b0);
              analysis::SharedPath<wasm::RandomLattice>::
              join<wasm::RandomElement<wasm::RandomLattice>>
                        ((SharedPath<wasm::RandomLattice> *)this_00,(Element *)local_290,
                         (RandomElement<wasm::RandomLattice> *)&local_2b0);
              RandomElement<wasm::RandomLattice>::~RandomElement
                        ((RandomElement<wasm::RandomLattice> *)&local_2b0);
              std::
              variant<wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
              ::
              variant<wasm::analysis::SharedPath<wasm::RandomLattice>::Element&,void,void,wasm::analysis::SharedPath<wasm::RandomLattice>::Element,void>
                        ((variant<wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                          *)&local_2d8,(Element *)local_290);
              RandomElement<wasm::RandomLattice>::RandomElement
                        ((RandomElement<wasm::RandomLattice> *)this,&local_2d8);
              ElementImpl::~ElementImpl(&local_2d8);
              _Var4._M_head_impl = extraout_RDX_08;
            }
            else {
              std::get<0ul,wasm::RandomLattice,wasm::RandomLattice>(&local_210->lattices);
              makeElement(&local_268);
              std::get<1ul,wasm::RandomLattice,wasm::RandomLattice>(&local_210->lattices);
              makeElement((RandomLattice *)&l_6);
              std::
              tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>
              ::
              tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>,_true>
                        (&local_258,(RandomElement<wasm::RandomLattice> *)&local_268,
                         (RandomElement<wasm::RandomLattice> *)&l_6);
              std::
              variant<wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
              ::
              variant<std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,void,void,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,void>
                        ((variant<wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                          *)&local_238,&local_258);
              RandomElement<wasm::RandomLattice>::RandomElement
                        ((RandomElement<wasm::RandomLattice> *)this,&local_238);
              ElementImpl::~ElementImpl(&local_238);
              std::
              tuple<wasm::RandomElement<wasm::RandomLattice>,_wasm::RandomElement<wasm::RandomLattice>_>
              ::~tuple(&local_258);
              RandomElement<wasm::RandomLattice>::~RandomElement
                        ((RandomElement<wasm::RandomLattice> *)&l_6);
              RandomElement<wasm::RandomLattice>::~RandomElement
                        ((RandomElement<wasm::RandomLattice> *)&local_268);
              _Var4._M_head_impl = extraout_RDX_07;
            }
          }
          else {
            std::
            vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
            ::vector((vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
                      *)&i);
            std::
            vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
            ::reserve((vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
                       *)&i,(size_type)
                            elem.
                            super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage[1].
                            super_unique_ptr<void,_void_(*)(void_*)>._M_t.
                            super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                            super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                            super__Tuple_impl<1UL,_void_(*)(void_*)>.
                            super__Head_base<1UL,_void_(*)(void_*),_false>);
            for (local_1d0._M_head_impl = (_func_void_void_ptr *)0x0;
                local_1d0._M_head_impl <
                (_func_void_void_ptr *)
                elem.
                super__Vector_base<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage[1].
                super_unique_ptr<void,_void_(*)(void_*)>._M_t.
                super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                super__Tuple_impl<1UL,_void_(*)(void_*)>.
                super__Head_base<1UL,_void_(*)(void_*),_false>;
                local_1d0._M_head_impl = local_1d0._M_head_impl + 1) {
              makeElement(&local_1e0);
              std::
              vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
              ::push_back((vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
                           *)&i,(value_type *)&local_1e0);
              RandomElement<wasm::RandomLattice>::~RandomElement
                        ((RandomElement<wasm::RandomLattice> *)&local_1e0);
            }
            std::
            variant<wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
            ::
            variant<std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,void,void,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,void>
                      ((variant<wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                        *)&l_5,(vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
                                *)&i);
            RandomElement<wasm::RandomLattice>::RandomElement
                      ((RandomElement<wasm::RandomLattice> *)this,(ElementImpl *)&l_5);
            ElementImpl::~ElementImpl((ElementImpl *)&l_5);
            std::
            vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
            ::~vector((vector<wasm::RandomElement<wasm::RandomLattice>,_std::allocator<wasm::RandomElement<wasm::RandomLattice>_>_>
                       *)&i);
            _Var4._M_head_impl = extraout_RDX_06;
          }
        }
        else {
          makeElement((RandomLattice *)&l_4);
          makeElement(&local_198);
          std::
          variant<wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
          ::
          variant<std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,void,void,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,void>
                    ((variant<wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                      *)&local_188,(array<wasm::RandomElement<wasm::RandomLattice>,_2UL> *)&l_4);
          RandomElement<wasm::RandomLattice>::RandomElement
                    ((RandomElement<wasm::RandomLattice> *)this,&local_188);
          ElementImpl::~ElementImpl(&local_188);
          std::array<wasm::RandomElement<wasm::RandomLattice>,_2UL>::~array
                    ((array<wasm::RandomElement<wasm::RandomLattice>,_2UL> *)&l_4);
          _Var4._M_head_impl = extraout_RDX_05;
        }
      }
      else {
        l_3._7_1_ = 0;
        bVar1 = Random::oneIn((Random *)*in_RSI,4);
        this_01 = local_100;
        if (bVar1) {
          analysis::Lift<wasm::RandomLattice>::getBottom(&local_140,local_100);
        }
        else {
          makeElement(&local_150);
          l_3._7_1_ = 1;
          analysis::Lift<wasm::RandomLattice>::get(&local_140,this_01,(Element *)&local_150);
        }
        std::
        variant<wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
        ::
        variant<wasm::analysis::Lift<wasm::RandomLattice>::Element,void,void,wasm::analysis::Lift<wasm::RandomLattice>::Element,void>
                  ((variant<wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                    *)&local_128,&local_140);
        RandomElement<wasm::RandomLattice>::RandomElement
                  ((RandomElement<wasm::RandomLattice> *)this,&local_128);
        ElementImpl::~ElementImpl(&local_128);
        analysis::Lift<wasm::RandomLattice>::Element::~Element(&local_140);
        _Var4._M_head_impl = extraout_RDX_03;
        if ((l_3._7_1_ & 1) != 0) {
          RandomElement<wasm::RandomLattice>::~RandomElement
                    ((RandomElement<wasm::RandomLattice> *)&local_150);
          _Var4._M_head_impl = extraout_RDX_04;
        }
      }
    }
    else {
      this_02 = (Flat<unsigned_int> *)0x6;
      local_64 = Random::upTo((Random *)*in_RSI,6);
      if (local_64 == 4) {
        pEVar3 = analysis::Flat<unsigned_int>::getBottom((Element *)ptStack_60,this_02);
        local_98 = SUB84(pEVar3,0);
        local_94 = (undefined1)((ulong)pEVar3 >> 0x20);
        std::
        variant<wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
        ::
        variant<wasm::analysis::Flat<unsigned_int>::Element,void,void,wasm::analysis::Flat<unsigned_int>::Element,void>
                  ((variant<wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                    *)&local_90,(Element *)&local_98);
        RandomElement<wasm::RandomLattice>::RandomElement
                  ((RandomElement<wasm::RandomLattice> *)this,&local_90);
        ElementImpl::~ElementImpl(&local_90);
        _Var4._M_head_impl = extraout_RDX_00;
      }
      else if (local_64 == 5) {
        pEVar3 = analysis::Flat<unsigned_int>::getTop((Element *)ptStack_60,this_02);
        local_c8 = SUB84(pEVar3,0);
        local_c4 = (undefined1)((ulong)pEVar3 >> 0x20);
        std::
        variant<wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
        ::
        variant<wasm::analysis::Flat<unsigned_int>::Element,void,void,wasm::analysis::Flat<unsigned_int>::Element,void>
                  ((variant<wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                    *)&local_c0,(Element *)&local_c8);
        RandomElement<wasm::RandomLattice>::RandomElement
                  ((RandomElement<wasm::RandomLattice> *)this,&local_c0);
        ElementImpl::~ElementImpl(&local_c0);
        _Var4._M_head_impl = extraout_RDX_01;
      }
      else {
        pEVar3 = analysis::Flat<unsigned_int>::get
                           ((Element *)ptStack_60,(Flat<unsigned_int> *)&local_64,val);
        l_2._0_4_ = SUB84(pEVar3,0);
        l_2._4_1_ = (undefined1)((ulong)pEVar3 >> 0x20);
        std::
        variant<wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
        ::
        variant<wasm::analysis::Flat<unsigned_int>::Element,void,void,wasm::analysis::Flat<unsigned_int>::Element,void>
                  ((variant<wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                    *)&local_f0,(Element *)&l_2);
        RandomElement<wasm::RandomLattice>::RandomElement
                  ((RandomElement<wasm::RandomLattice> *)this,&local_f0);
        ElementImpl::~ElementImpl(&local_f0);
        _Var4._M_head_impl = extraout_RDX_02;
      }
    }
  }
  else {
    RandomFullLattice::makeElement((RandomFullLattice *)&l_1);
    std::
    variant<wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
    ::
    variant<wasm::RandomElement<wasm::RandomFullLattice>,void,void,wasm::RandomElement<wasm::RandomFullLattice>,void>
              ((variant<wasm::RandomElement<wasm::RandomFullLattice>,wasm::analysis::Flat<unsigned_int>::Element,wasm::analysis::Lift<wasm::RandomLattice>::Element,std::array<wasm::RandomElement<wasm::RandomLattice>,2ul>,std::vector<wasm::RandomElement<wasm::RandomLattice>,std::allocator<wasm::RandomElement<wasm::RandomLattice>>>,std::tuple<wasm::RandomElement<wasm::RandomLattice>,wasm::RandomElement<wasm::RandomLattice>>,wasm::analysis::SharedPath<wasm::RandomLattice>::Element>
                *)&local_48,(RandomElement<wasm::RandomFullLattice> *)&l_1);
    RandomElement<wasm::RandomLattice>::RandomElement
              ((RandomElement<wasm::RandomLattice> *)this,&local_48);
    ElementImpl::~ElementImpl(&local_48);
    RandomElement<wasm::RandomFullLattice>::~RandomElement
              ((RandomElement<wasm::RandomFullLattice> *)&l_1);
    _Var4._M_head_impl = extraout_RDX;
  }
  EVar6.super_unique_ptr<void,_void_(*)(void_*)>._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>.
  _M_t.super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>.
  _M_head_impl = _Var4._M_head_impl;
  EVar6.super_unique_ptr<void,_void_(*)(void_*)>._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>.
  _M_t.super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)(_Head_base<1UL,_void_(*)(void_*),_false>)this;
  return (Element)EVar6.super_unique_ptr<void,_void_(*)(void_*)>._M_t.
                  super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>;
}

Assistant:

RandomLattice::Element RandomLattice::makeElement() const noexcept {
  if (const auto* l = std::get_if<RandomFullLattice>(lattice.get())) {
    return ElementImpl{l->makeElement()};
  }
  if (const auto* l = std::get_if<Flat<uint32_t>>(lattice.get())) {
    auto pick = rand.upTo(6);
    switch (pick) {
      case 4:
        return ElementImpl{l->getBottom()};
      case 5:
        return ElementImpl{l->getTop()};
      default:
        return ElementImpl{l->get(std::move(pick))};
    }
  }
  if (const auto* l = std::get_if<Lift<RandomLattice>>(lattice.get())) {
    return ElementImpl{rand.oneIn(4) ? l->getBottom()
                                     : l->get(l->lattice.makeElement())};
  }
  if (const auto* l = std::get_if<ArrayLattice>(lattice.get())) {
    return ElementImpl{typename ArrayLattice::Element{
      l->lattice.makeElement(), l->lattice.makeElement()}};
  }
  if (const auto* l = std::get_if<Vector<RandomLattice>>(lattice.get())) {
    std::vector<typename RandomLattice::Element> elem;
    elem.reserve(l->size);
    for (size_t i = 0; i < l->size; ++i) {
      elem.push_back(l->lattice.makeElement());
    }
    return ElementImpl{std::move(elem)};
  }
  if (const auto* l = std::get_if<TupleLattice>(lattice.get())) {
    return ElementImpl{
      typename TupleLattice::Element{std::get<0>(l->lattices).makeElement(),
                                     std::get<1>(l->lattices).makeElement()}};
  }
  if (const auto* l = std::get_if<SharedPath<RandomLattice>>(lattice.get())) {
    auto elem = l->getBottom();
    l->join(elem, l->lattice.makeElement());
    return ElementImpl{elem};
  }
  WASM_UNREACHABLE("unexpected lattice");
}